

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

void doctest::detail::toStream(ostream *s,bool in)

{
  ostream *poVar1;
  
  *(uint *)(&s->field_0x18 + (long)s->_vptr_basic_ostream[-3]) =
       *(uint *)(&s->field_0x18 + (long)s->_vptr_basic_ostream[-3]) | 1;
  poVar1 = std::ostream::_M_insert<bool>(SUB81(s,0));
  *(uint *)(&poVar1->field_0x18 + (long)poVar1->_vptr_basic_ostream[-3]) =
       *(uint *)(&poVar1->field_0x18 + (long)poVar1->_vptr_basic_ostream[-3]) & 0xfffffffe;
  return;
}

Assistant:

void toStream(std::ostream* s, bool in) { *s << std::boolalpha << in << std::noboolalpha; }